

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O1

void fill_block(__m128i *state,block *ref_block,block *next_block,int with_xor)

{
  ulong *puVar1;
  ulong *puVar2;
  undefined4 *puVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined1 auVar21 [16];
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 in_XMM11 [16];
  undefined1 in_XMM12 [16];
  ulong auStack_408 [129];
  ulong uVar59;
  ulong uVar70;
  
  lVar22 = 0;
  if (with_xor == 0) {
    do {
      puVar1 = (ulong *)((long)ref_block->v + lVar22);
      puVar2 = (ulong *)((long)*state + lVar22);
      uVar59 = *puVar1 ^ *puVar2;
      uVar70 = puVar1[1] ^ puVar2[1];
      puVar1 = (ulong *)((long)*state + lVar22);
      *puVar1 = uVar59;
      puVar1[1] = uVar70;
      *(ulong *)((long)auStack_408 + lVar22) = uVar59;
      *(ulong *)((long)auStack_408 + lVar22 + 8) = uVar70;
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x400);
  }
  else {
    do {
      puVar1 = (ulong *)((long)ref_block->v + lVar22);
      puVar2 = (ulong *)((long)*state + lVar22);
      uVar70 = *puVar1 ^ *puVar2;
      uVar23 = puVar1[1] ^ puVar2[1];
      puVar1 = (ulong *)((long)*state + lVar22);
      *puVar1 = uVar70;
      puVar1[1] = uVar23;
      puVar1 = (ulong *)((long)next_block->v + lVar22);
      uVar59 = puVar1[1];
      *(ulong *)((long)auStack_408 + lVar22) = *puVar1 ^ uVar70;
      *(ulong *)((long)auStack_408 + lVar22 + 8) = uVar59 ^ uVar23;
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x400);
  }
  auVar21 = _DAT_00124a80;
  lVar22 = 0;
  do {
    puVar1 = (ulong *)((long)*state + lVar22);
    uVar59 = *puVar1;
    uVar70 = puVar1[1];
    puVar1 = (ulong *)((long)state[1] + lVar22);
    uVar23 = *puVar1;
    uVar20 = puVar1[1];
    auVar24 = *(undefined1 (*) [16])((long)state[2] + lVar22);
    auVar25 = *(undefined1 (*) [16])((long)state[3] + lVar22);
    auVar39._0_8_ = (ulong)auVar24._0_4_ * (uVar59 & 0xffffffff) * 2 + uVar59 + auVar24._0_8_;
    auVar39._8_8_ =
         (auVar24._8_8_ & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar70 + auVar24._8_8_;
    auVar79._0_8_ = (ulong)auVar25._0_4_ * (uVar23 & 0xffffffff) * 2 + uVar23 + auVar25._0_8_;
    auVar79._8_8_ =
         (auVar25._8_8_ & 0xffffffff) * (uVar20 & 0xffffffff) * 2 + uVar20 + auVar25._8_8_;
    auVar45 = *(undefined1 (*) [16])((long)state[6] + lVar22) ^ auVar39;
    auVar52 = *(undefined1 (*) [16])((long)state[7] + lVar22) ^ auVar79;
    puVar3 = (undefined4 *)((long)state[6] + lVar22);
    *puVar3 = auVar45._4_4_;
    puVar3[1] = auVar45._0_4_;
    puVar3[2] = auVar45._12_4_;
    puVar3[3] = auVar45._8_4_;
    puVar3 = (undefined4 *)((long)state[7] + lVar22);
    *puVar3 = auVar52._4_4_;
    puVar3[1] = auVar52._0_4_;
    puVar3[2] = auVar52._12_4_;
    puVar3[3] = auVar52._8_4_;
    puVar1 = (ulong *)((long)state[4] + lVar22);
    uVar59 = *puVar1;
    uVar70 = puVar1[1];
    auVar45 = *(undefined1 (*) [16])((long)state[6] + lVar22);
    auVar60._0_8_ = (ulong)auVar45._0_4_ * (uVar59 & 0xffffffff) * 2 + uVar59 + auVar45._0_8_;
    auVar60._8_8_ =
         (auVar45._8_8_ & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar70 + auVar45._8_8_;
    *(undefined1 (*) [16])((long)state[4] + lVar22) = auVar60;
    puVar1 = (ulong *)((long)state[5] + lVar22);
    uVar59 = *puVar1;
    uVar70 = puVar1[1];
    auVar52 = *(undefined1 (*) [16])((long)state[7] + lVar22);
    auVar71._0_8_ = (ulong)auVar52._0_4_ * (uVar59 & 0xffffffff) * 2 + uVar59 + auVar52._0_8_;
    auVar71._8_8_ =
         (auVar52._8_8_ & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar70 + auVar52._8_8_;
    *(undefined1 (*) [16])((long)state[5] + lVar22) = auVar71;
    auVar24 = pshufb(auVar24 ^ auVar60,auVar21);
    *(undefined1 (*) [16])((long)state[2] + lVar22) = auVar24;
    auVar32 = pshufb(auVar25 ^ auVar71,auVar21);
    *(undefined1 (*) [16])((long)state[3] + lVar22) = auVar32;
    auVar46._0_8_ =
         (ulong)auVar24._0_4_ * (auVar39._0_8_ & 0xffffffff) * 2 + auVar39._0_8_ + auVar24._0_8_;
    auVar46._8_8_ =
         (auVar24._8_8_ & 0xffffffff) * (auVar39._8_8_ & 0xffffffff) * 2 +
         auVar39._8_8_ + auVar24._8_8_;
    *(undefined1 (*) [16])((long)*state + lVar22) = auVar46;
    auVar53._0_8_ =
         (ulong)auVar32._0_4_ * (auVar79._0_8_ & 0xffffffff) * 2 + auVar79._0_8_ + auVar32._0_8_;
    auVar53._8_8_ =
         (auVar32._8_8_ & 0xffffffff) * (auVar79._8_8_ & 0xffffffff) * 2 +
         auVar79._8_8_ + auVar32._8_8_;
    *(undefined1 (*) [16])((long)state[1] + lVar22) = auVar53;
    auVar52 = auVar52 ^ auVar53;
    *(undefined1 (*) [16])((long)state[7] + lVar22) = auVar52;
    auVar45 = pshuflw(auVar45 ^ auVar46,auVar45 ^ auVar46,0x39);
    in_XMM11 = pshufhw(in_XMM11,auVar45,0x39);
    *(undefined1 (*) [16])((long)state[6] + lVar22) = in_XMM11;
    auVar79 = pshuflw(auVar52,auVar52,0x39);
    in_XMM12 = pshufhw(in_XMM12,auVar79,0x39);
    *(undefined1 (*) [16])((long)state[7] + lVar22) = in_XMM12;
    auVar40._0_8_ =
         (ulong)in_XMM11._0_4_ * (auVar60._0_8_ & 0xffffffff) * 2 + auVar60._0_8_ + in_XMM11._0_8_;
    auVar40._8_8_ =
         (in_XMM11._8_8_ & 0xffffffff) * (auVar60._8_8_ & 0xffffffff) * 2 +
         auVar60._8_8_ + in_XMM11._8_8_;
    *(undefined1 (*) [16])((long)state[4] + lVar22) = auVar40;
    auVar61._0_8_ =
         (ulong)in_XMM12._0_4_ * (auVar71._0_8_ & 0xffffffff) * 2 + auVar71._0_8_ + in_XMM12._0_8_;
    auVar61._8_8_ =
         (in_XMM12._8_8_ & 0xffffffff) * (auVar71._8_8_ & 0xffffffff) * 2 +
         auVar71._8_8_ + in_XMM12._8_8_;
    *(undefined1 (*) [16])((long)state[5] + lVar22) = auVar61;
    auVar24 = auVar24 ^ auVar40;
    *(undefined1 (*) [16])((long)state[2] + lVar22) = auVar24;
    auVar32 = auVar32 ^ auVar61;
    *(undefined1 (*) [16])((long)state[3] + lVar22) = auVar32;
    auVar52._0_8_ = auVar24._0_8_ >> 0x3f;
    auVar52._8_8_ = auVar24._8_8_ >> 0x3f;
    auVar25._8_8_ = auVar24._8_8_ * 2;
    auVar25._0_8_ = auVar24._0_8_ * 2;
    auVar25 = auVar25 | auVar52;
    *(undefined1 (*) [16])((long)state[2] + lVar22) = auVar25;
    auVar24._0_8_ = auVar32._0_8_ >> 0x3f;
    auVar24._8_8_ = auVar32._8_8_ >> 0x3f;
    auVar33._8_8_ = auVar32._8_8_ * 2;
    auVar33._0_8_ = auVar32._0_8_ * 2;
    auVar33 = auVar33 | auVar24;
    *(undefined1 (*) [16])((long)state[3] + lVar22) = auVar33;
    auVar4._16_16_ = auVar33;
    auVar4._0_16_ = auVar25;
    auVar5._16_16_ = auVar25;
    auVar5._0_16_ = auVar33;
    *(undefined1 (*) [16])((long)state[2] + lVar22) = auVar4._8_16_;
    *(undefined1 (*) [16])((long)state[3] + lVar22) = auVar5._8_16_;
    *(undefined1 (*) [16])((long)state[4] + lVar22) = auVar61;
    *(undefined1 (*) [16])((long)state[5] + lVar22) = auVar40;
    auVar6._16_16_ = auVar79;
    auVar6._0_16_ = in_XMM11;
    auVar7._16_16_ = auVar45;
    auVar7._0_16_ = in_XMM12;
    *(undefined1 (*) [16])((long)state[6] + lVar22) = auVar7._8_16_;
    *(undefined1 (*) [16])((long)state[7] + lVar22) = auVar6._8_16_;
    auVar72._0_8_ =
         (ulong)auVar25._8_4_ * (auVar46._0_8_ & 0xffffffff) * 2 + auVar46._0_8_ + auVar25._8_8_;
    auVar72._8_8_ =
         (auVar33._0_8_ & 0xffffffff) * (auVar46._8_8_ & 0xffffffff) * 2 +
         auVar46._8_8_ + auVar33._0_8_;
    *(undefined1 (*) [16])((long)*state + lVar22) = auVar72;
    auVar47._0_8_ =
         (ulong)auVar33._8_4_ * (auVar53._0_8_ & 0xffffffff) * 2 + auVar53._0_8_ + auVar33._8_8_;
    auVar47._8_8_ =
         (auVar25._0_8_ & 0xffffffff) * (auVar53._8_8_ & 0xffffffff) * 2 +
         auVar53._8_8_ + auVar25._0_8_;
    auVar24 = *(undefined1 (*) [16])((long)state[6] + lVar22) ^ auVar72;
    auVar25 = *(undefined1 (*) [16])((long)state[7] + lVar22) ^ auVar47;
    auVar34._0_8_ = CONCAT44(auVar24._0_4_,auVar24._4_4_);
    auVar34._8_4_ = auVar24._12_4_;
    auVar34._12_4_ = auVar24._8_4_;
    *(undefined1 (*) [16])((long)state[6] + lVar22) = auVar34;
    puVar3 = (undefined4 *)((long)state[7] + lVar22);
    *puVar3 = auVar25._4_4_;
    puVar3[1] = auVar25._0_4_;
    puVar3[2] = auVar25._12_4_;
    puVar3[3] = auVar25._8_4_;
    auVar54._0_8_ =
         (ulong)auVar24._4_4_ * (auVar61._0_8_ & 0xffffffff) * 2 + auVar61._0_8_ + auVar34._0_8_;
    auVar54._8_8_ =
         (auVar34._8_8_ & 0xffffffff) * (auVar61._8_8_ & 0xffffffff) * 2 +
         auVar61._8_8_ + auVar34._8_8_;
    auVar24 = *(undefined1 (*) [16])((long)state[7] + lVar22);
    auVar41._0_8_ = auVar40._0_8_ + auVar24._0_8_;
    auVar41._8_8_ = auVar40._8_8_ + auVar24._8_8_;
    auVar62._0_8_ = (ulong)auVar24._0_4_ * (auVar40._0_8_ & 0xffffffff) * 2 + auVar41._0_8_;
    auVar62._8_8_ = (auVar24._8_8_ & 0xffffffff) * (auVar40._8_8_ & 0xffffffff) * 2 + auVar41._8_8_;
    auVar25 = pshufb(auVar54,auVar21);
    auVar52 = pshufb(auVar4._8_16_,auVar21);
    auVar52 = auVar52 ^ auVar25;
    auVar25 = pshufb(auVar5._8_16_,auVar21);
    auVar79 = pshufb(auVar62,auVar21);
    auVar79 = auVar79 ^ auVar25;
    auVar45._0_8_ =
         (ulong)auVar52._0_4_ * (auVar72._0_8_ & 0xffffffff) * 2 + auVar72._0_8_ + auVar52._0_8_;
    auVar45._8_8_ =
         (auVar52._8_8_ & 0xffffffff) * (auVar72._8_8_ & 0xffffffff) * 2 +
         auVar72._8_8_ + auVar52._8_8_;
    *(undefined1 (*) [16])((long)*state + lVar22) = auVar45;
    auVar48._0_8_ = auVar47._0_8_ + auVar79._0_8_;
    auVar48._8_8_ = auVar47._8_8_ + auVar79._8_8_;
    auVar73._0_8_ = (ulong)auVar79._0_4_ * (auVar47._0_8_ & 0xffffffff) * 2 + auVar48._0_8_;
    auVar73._8_8_ = (auVar79._8_8_ & 0xffffffff) * (auVar47._8_8_ & 0xffffffff) * 2 + auVar48._8_8_;
    *(undefined1 (*) [16])((long)state[1] + lVar22) = auVar73;
    auVar45 = auVar45 ^ *(undefined1 (*) [16])((long)state[6] + lVar22);
    auVar25 = pshuflw(auVar45,auVar45,0x39);
    auVar45 = pshufhw(auVar41,auVar25,0x39);
    auVar33 = pshuflw(auVar48,auVar73 ^ auVar24,0x39);
    auVar24 = pshufhw(auVar73 ^ auVar24,auVar33,0x39);
    auVar77._0_8_ =
         (ulong)auVar45._0_4_ * (auVar54._0_8_ & 0xffffffff) * 2 + auVar54._0_8_ + auVar45._0_8_;
    auVar77._8_8_ =
         (auVar45._8_8_ & 0xffffffff) * (auVar54._8_8_ & 0xffffffff) * 2 +
         auVar54._8_8_ + auVar45._8_8_;
    auVar55._0_8_ =
         (ulong)auVar24._0_4_ * (auVar62._0_8_ & 0xffffffff) * 2 + auVar62._0_8_ + auVar24._0_8_;
    auVar55._8_8_ =
         (auVar24._8_8_ & 0xffffffff) * (auVar62._8_8_ & 0xffffffff) * 2 +
         auVar62._8_8_ + auVar24._8_8_;
    uVar59 = SUB168(auVar52 ^ auVar77,0);
    uVar70 = SUB168(auVar52 ^ auVar77,8);
    auVar63._0_8_ = uVar59 >> 0x3f;
    auVar63._8_8_ = uVar70 >> 0x3f;
    auVar32._8_8_ = uVar70 * 2;
    auVar32._0_8_ = uVar59 * 2;
    uVar59 = SUB168(auVar79 ^ auVar55,0);
    uVar70 = SUB168(auVar79 ^ auVar55,8);
    auVar64._0_8_ = uVar59 >> 0x3f;
    auVar64._8_8_ = uVar70 >> 0x3f;
    auVar35._8_8_ = uVar70 * 2;
    auVar35._0_8_ = uVar59 * 2;
    auVar8._16_16_ = auVar32 | auVar63;
    auVar8._0_16_ = auVar35 | auVar64;
    auVar9._16_16_ = auVar35 | auVar64;
    auVar9._0_16_ = auVar32 | auVar63;
    *(undefined1 (*) [16])((long)state[2] + lVar22) = auVar8._8_16_;
    *(undefined1 (*) [16])((long)state[3] + lVar22) = auVar9._8_16_;
    *(undefined1 (*) [16])((long)state[4] + lVar22) = auVar55;
    *(undefined1 (*) [16])((long)state[5] + lVar22) = auVar77;
    auVar10._16_16_ = auVar25;
    auVar10._0_16_ = auVar24;
    auVar11._16_16_ = auVar33;
    auVar11._0_16_ = auVar45;
    *(undefined1 (*) [16])((long)state[6] + lVar22) = auVar11._8_16_;
    *(undefined1 (*) [16])((long)state[7] + lVar22) = auVar10._8_16_;
    lVar22 = lVar22 + 0x80;
  } while (lVar22 != 0x400);
  lVar22 = -0x80;
  do {
    puVar1 = (ulong *)((long)state[8] + lVar22);
    uVar59 = *puVar1;
    uVar70 = puVar1[1];
    puVar1 = (ulong *)((long)state[0x10] + lVar22);
    uVar23 = *puVar1;
    uVar20 = puVar1[1];
    auVar24 = *(undefined1 (*) [16])((long)state[0x18] + lVar22);
    auVar25 = *(undefined1 (*) [16])((long)state[0x20] + lVar22);
    auVar42._0_8_ = (ulong)auVar24._0_4_ * (uVar59 & 0xffffffff) * 2 + uVar59 + auVar24._0_8_;
    auVar42._8_8_ =
         (auVar24._8_8_ & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar70 + auVar24._8_8_;
    auVar28._0_8_ = (ulong)auVar25._0_4_ * (uVar23 & 0xffffffff) * 2 + uVar23 + auVar25._0_8_;
    auVar28._8_8_ =
         (auVar25._8_8_ & 0xffffffff) * (uVar20 & 0xffffffff) * 2 + uVar20 + auVar25._8_8_;
    auVar45 = *(undefined1 (*) [16])((long)state[0x38] + lVar22) ^ auVar42;
    auVar52 = *(undefined1 (*) [16])((long)state[0x40] + lVar22) ^ auVar28;
    puVar3 = (undefined4 *)((long)state[0x38] + lVar22);
    *puVar3 = auVar45._4_4_;
    puVar3[1] = auVar45._0_4_;
    puVar3[2] = auVar45._12_4_;
    puVar3[3] = auVar45._8_4_;
    puVar3 = (undefined4 *)((long)state[0x40] + lVar22);
    *puVar3 = auVar52._4_4_;
    puVar3[1] = auVar52._0_4_;
    puVar3[2] = auVar52._12_4_;
    puVar3[3] = auVar52._8_4_;
    puVar1 = (ulong *)((long)state[0x28] + lVar22);
    uVar59 = *puVar1;
    uVar70 = puVar1[1];
    auVar45 = *(undefined1 (*) [16])((long)state[0x38] + lVar22);
    auVar65._0_8_ = (ulong)auVar45._0_4_ * (uVar59 & 0xffffffff) * 2 + uVar59 + auVar45._0_8_;
    auVar65._8_8_ =
         (auVar45._8_8_ & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar70 + auVar45._8_8_;
    *(undefined1 (*) [16])((long)state[0x28] + lVar22) = auVar65;
    puVar1 = (ulong *)((long)state[0x30] + lVar22);
    uVar59 = *puVar1;
    uVar70 = puVar1[1];
    auVar52 = *(undefined1 (*) [16])((long)state[0x40] + lVar22);
    auVar74._0_8_ = (ulong)auVar52._0_4_ * (uVar59 & 0xffffffff) * 2 + uVar59 + auVar52._0_8_;
    auVar74._8_8_ =
         (auVar52._8_8_ & 0xffffffff) * (uVar70 & 0xffffffff) * 2 + uVar70 + auVar52._8_8_;
    *(undefined1 (*) [16])((long)state[0x30] + lVar22) = auVar74;
    auVar24 = pshufb(auVar24 ^ auVar65,auVar21);
    *(undefined1 (*) [16])((long)state[0x18] + lVar22) = auVar24;
    auVar25 = pshufb(auVar25 ^ auVar74,auVar21);
    *(undefined1 (*) [16])((long)state[0x20] + lVar22) = auVar25;
    auVar49._0_8_ =
         (ulong)auVar24._0_4_ * (auVar42._0_8_ & 0xffffffff) * 2 + auVar42._0_8_ + auVar24._0_8_;
    auVar49._8_8_ =
         (auVar24._8_8_ & 0xffffffff) * (auVar42._8_8_ & 0xffffffff) * 2 +
         auVar42._8_8_ + auVar24._8_8_;
    *(undefined1 (*) [16])((long)state[8] + lVar22) = auVar49;
    auVar56._0_8_ =
         (ulong)auVar25._0_4_ * (auVar28._0_8_ & 0xffffffff) * 2 + auVar28._0_8_ + auVar25._0_8_;
    auVar56._8_8_ =
         (auVar25._8_8_ & 0xffffffff) * (auVar28._8_8_ & 0xffffffff) * 2 +
         auVar28._8_8_ + auVar25._8_8_;
    *(undefined1 (*) [16])((long)state[0x10] + lVar22) = auVar56;
    auVar52 = auVar52 ^ auVar56;
    *(undefined1 (*) [16])((long)state[0x40] + lVar22) = auVar52;
    auVar45 = pshuflw(auVar45 ^ auVar49,auVar45 ^ auVar49,0x39);
    in_XMM11 = pshufhw(in_XMM11,auVar45,0x39);
    *(undefined1 (*) [16])((long)state[0x38] + lVar22) = in_XMM11;
    auVar52 = pshuflw(auVar52,auVar52,0x39);
    in_XMM12 = pshufhw(in_XMM12,auVar52,0x39);
    *(undefined1 (*) [16])((long)state[0x40] + lVar22) = in_XMM12;
    auVar43._0_8_ =
         (ulong)in_XMM11._0_4_ * (auVar65._0_8_ & 0xffffffff) * 2 + auVar65._0_8_ + in_XMM11._0_8_;
    auVar43._8_8_ =
         (in_XMM11._8_8_ & 0xffffffff) * (auVar65._8_8_ & 0xffffffff) * 2 +
         auVar65._8_8_ + in_XMM11._8_8_;
    *(undefined1 (*) [16])((long)state[0x28] + lVar22) = auVar43;
    auVar66._0_8_ =
         (ulong)in_XMM12._0_4_ * (auVar74._0_8_ & 0xffffffff) * 2 + auVar74._0_8_ + in_XMM12._0_8_;
    auVar66._8_8_ =
         (in_XMM12._8_8_ & 0xffffffff) * (auVar74._8_8_ & 0xffffffff) * 2 +
         auVar74._8_8_ + in_XMM12._8_8_;
    *(undefined1 (*) [16])((long)state[0x30] + lVar22) = auVar66;
    auVar24 = auVar24 ^ auVar43;
    *(undefined1 (*) [16])((long)state[0x18] + lVar22) = auVar24;
    auVar25 = auVar25 ^ auVar66;
    *(undefined1 (*) [16])((long)state[0x20] + lVar22) = auVar25;
    auVar29._0_8_ = auVar24._0_8_ >> 0x3f;
    auVar29._8_8_ = auVar24._8_8_ >> 0x3f;
    auVar26._8_8_ = auVar24._8_8_ * 2;
    auVar26._0_8_ = auVar24._0_8_ * 2;
    auVar26 = auVar26 | auVar29;
    *(undefined1 (*) [16])((long)state[0x18] + lVar22) = auVar26;
    auVar30._0_8_ = auVar25._0_8_ >> 0x3f;
    auVar30._8_8_ = auVar25._8_8_ >> 0x3f;
    auVar36._8_8_ = auVar25._8_8_ * 2;
    auVar36._0_8_ = auVar25._0_8_ * 2;
    auVar36 = auVar36 | auVar30;
    *(undefined1 (*) [16])((long)state[0x20] + lVar22) = auVar36;
    auVar12._16_16_ = auVar36;
    auVar12._0_16_ = auVar26;
    auVar13._16_16_ = auVar26;
    auVar13._0_16_ = auVar36;
    *(undefined1 (*) [16])((long)state[0x18] + lVar22) = auVar12._8_16_;
    *(undefined1 (*) [16])((long)state[0x20] + lVar22) = auVar13._8_16_;
    *(undefined1 (*) [16])((long)state[0x28] + lVar22) = auVar66;
    *(undefined1 (*) [16])((long)state[0x30] + lVar22) = auVar43;
    auVar14._16_16_ = auVar52;
    auVar14._0_16_ = in_XMM11;
    auVar15._16_16_ = auVar45;
    auVar15._0_16_ = in_XMM12;
    *(undefined1 (*) [16])((long)state[0x38] + lVar22) = auVar15._8_16_;
    *(undefined1 (*) [16])((long)state[0x40] + lVar22) = auVar14._8_16_;
    auVar75._0_8_ =
         (ulong)auVar26._8_4_ * (auVar49._0_8_ & 0xffffffff) * 2 + auVar49._0_8_ + auVar26._8_8_;
    auVar75._8_8_ =
         (auVar36._0_8_ & 0xffffffff) * (auVar49._8_8_ & 0xffffffff) * 2 +
         auVar49._8_8_ + auVar36._0_8_;
    *(undefined1 (*) [16])((long)state[8] + lVar22) = auVar75;
    auVar50._0_8_ =
         (ulong)auVar36._8_4_ * (auVar56._0_8_ & 0xffffffff) * 2 + auVar56._0_8_ + auVar36._8_8_;
    auVar50._8_8_ =
         (auVar26._0_8_ & 0xffffffff) * (auVar56._8_8_ & 0xffffffff) * 2 +
         auVar56._8_8_ + auVar26._0_8_;
    auVar24 = *(undefined1 (*) [16])((long)state[0x38] + lVar22) ^ auVar75;
    auVar25 = *(undefined1 (*) [16])((long)state[0x40] + lVar22) ^ auVar50;
    auVar37._0_8_ = CONCAT44(auVar24._0_4_,auVar24._4_4_);
    auVar37._8_4_ = auVar24._12_4_;
    auVar37._12_4_ = auVar24._8_4_;
    *(undefined1 (*) [16])((long)state[0x38] + lVar22) = auVar37;
    puVar3 = (undefined4 *)((long)state[0x40] + lVar22);
    *puVar3 = auVar25._4_4_;
    puVar3[1] = auVar25._0_4_;
    puVar3[2] = auVar25._12_4_;
    puVar3[3] = auVar25._8_4_;
    auVar57._0_8_ =
         (ulong)auVar24._4_4_ * (auVar66._0_8_ & 0xffffffff) * 2 + auVar66._0_8_ + auVar37._0_8_;
    auVar57._8_8_ =
         (auVar37._8_8_ & 0xffffffff) * (auVar66._8_8_ & 0xffffffff) * 2 +
         auVar66._8_8_ + auVar37._8_8_;
    auVar24 = *(undefined1 (*) [16])((long)state[0x40] + lVar22);
    auVar44._0_8_ = auVar43._0_8_ + auVar24._0_8_;
    auVar44._8_8_ = auVar43._8_8_ + auVar24._8_8_;
    auVar67._0_8_ = (ulong)auVar24._0_4_ * (auVar43._0_8_ & 0xffffffff) * 2 + auVar44._0_8_;
    auVar67._8_8_ = (auVar24._8_8_ & 0xffffffff) * (auVar43._8_8_ & 0xffffffff) * 2 + auVar44._8_8_;
    auVar25 = pshufb(auVar57,auVar21);
    auVar45 = pshufb(auVar12._8_16_,auVar21);
    auVar45 = auVar45 ^ auVar25;
    auVar25 = pshufb(auVar13._8_16_,auVar21);
    auVar52 = pshufb(auVar67,auVar21);
    auVar52 = auVar52 ^ auVar25;
    auVar27._0_8_ =
         (ulong)auVar45._0_4_ * (auVar75._0_8_ & 0xffffffff) * 2 + auVar75._0_8_ + auVar45._0_8_;
    auVar27._8_8_ =
         (auVar45._8_8_ & 0xffffffff) * (auVar75._8_8_ & 0xffffffff) * 2 +
         auVar75._8_8_ + auVar45._8_8_;
    *(undefined1 (*) [16])((long)state[8] + lVar22) = auVar27;
    auVar51._0_8_ = auVar50._0_8_ + auVar52._0_8_;
    auVar51._8_8_ = auVar50._8_8_ + auVar52._8_8_;
    auVar76._0_8_ = (ulong)auVar52._0_4_ * (auVar50._0_8_ & 0xffffffff) * 2 + auVar51._0_8_;
    auVar76._8_8_ = (auVar52._8_8_ & 0xffffffff) * (auVar50._8_8_ & 0xffffffff) * 2 + auVar51._8_8_;
    *(undefined1 (*) [16])((long)state[0x10] + lVar22) = auVar76;
    auVar27 = auVar27 ^ *(undefined1 (*) [16])((long)state[0x38] + lVar22);
    auVar25 = pshuflw(auVar27,auVar27,0x39);
    auVar79 = pshufhw(auVar44,auVar25,0x39);
    auVar32 = pshuflw(auVar51,auVar76 ^ auVar24,0x39);
    auVar24 = pshufhw(auVar76 ^ auVar24,auVar32,0x39);
    auVar78._0_8_ =
         (ulong)auVar79._0_4_ * (auVar57._0_8_ & 0xffffffff) * 2 + auVar57._0_8_ + auVar79._0_8_;
    auVar78._8_8_ =
         (auVar79._8_8_ & 0xffffffff) * (auVar57._8_8_ & 0xffffffff) * 2 +
         auVar57._8_8_ + auVar79._8_8_;
    auVar58._0_8_ =
         (ulong)auVar24._0_4_ * (auVar67._0_8_ & 0xffffffff) * 2 + auVar67._0_8_ + auVar24._0_8_;
    auVar58._8_8_ =
         (auVar24._8_8_ & 0xffffffff) * (auVar67._8_8_ & 0xffffffff) * 2 +
         auVar67._8_8_ + auVar24._8_8_;
    uVar59 = SUB168(auVar45 ^ auVar78,0);
    uVar70 = SUB168(auVar45 ^ auVar78,8);
    auVar68._0_8_ = uVar59 >> 0x3f;
    auVar68._8_8_ = uVar70 >> 0x3f;
    auVar31._8_8_ = uVar70 * 2;
    auVar31._0_8_ = uVar59 * 2;
    uVar59 = SUB168(auVar52 ^ auVar58,0);
    uVar70 = SUB168(auVar52 ^ auVar58,8);
    auVar69._0_8_ = uVar59 >> 0x3f;
    auVar69._8_8_ = uVar70 >> 0x3f;
    auVar38._8_8_ = uVar70 * 2;
    auVar38._0_8_ = uVar59 * 2;
    auVar16._16_16_ = auVar31 | auVar68;
    auVar16._0_16_ = auVar38 | auVar69;
    auVar17._16_16_ = auVar38 | auVar69;
    auVar17._0_16_ = auVar31 | auVar68;
    *(undefined1 (*) [16])((long)state[0x18] + lVar22) = auVar16._8_16_;
    *(undefined1 (*) [16])((long)state[0x20] + lVar22) = auVar17._8_16_;
    *(undefined1 (*) [16])((long)state[0x28] + lVar22) = auVar58;
    *(undefined1 (*) [16])((long)state[0x30] + lVar22) = auVar78;
    auVar18._16_16_ = auVar25;
    auVar18._0_16_ = auVar24;
    auVar19._16_16_ = auVar32;
    auVar19._0_16_ = auVar79;
    *(undefined1 (*) [16])((long)state[0x38] + lVar22) = auVar19._8_16_;
    *(undefined1 (*) [16])((long)state[0x40] + lVar22) = auVar18._8_16_;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0);
  lVar22 = 0;
  do {
    puVar1 = (ulong *)((long)*state + lVar22);
    uVar59 = *(ulong *)((long)auStack_408 + lVar22) ^ *puVar1;
    uVar70 = *(ulong *)((long)auStack_408 + lVar22 + 8) ^ puVar1[1];
    puVar1 = (ulong *)((long)*state + lVar22);
    *puVar1 = uVar59;
    puVar1[1] = uVar70;
    puVar1 = (ulong *)((long)next_block->v + lVar22);
    *puVar1 = uVar59;
    puVar1[1] = uVar70;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x400);
  return;
}

Assistant:

static void fill_block(const block *prev_block, const block *ref_block,
	block *next_block, int with_xor) {
	block blockR, block_tmp;
	unsigned i;

	copy_block(&blockR, ref_block);
	xor_block(&blockR, prev_block);
	copy_block(&block_tmp, &blockR);
	/* Now blockR = ref_block + prev_block and block_tmp = ref_block + prev_block */
	if (with_xor) {
		/* Saving the next block contents for XOR over: */
		xor_block(&block_tmp, next_block);
		/* Now blockR = ref_block + prev_block and
		   block_tmp = ref_block + prev_block + next_block */
	}

	/* Apply Blake2 on columns of 64-bit words: (0,1,...,15) , then
	   (16,17,..31)... finally (112,113,...127) */
	for (i = 0; i < 8; ++i) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[16 * i], blockR.v[16 * i + 1], blockR.v[16 * i + 2],
			blockR.v[16 * i + 3], blockR.v[16 * i + 4], blockR.v[16 * i + 5],
			blockR.v[16 * i + 6], blockR.v[16 * i + 7], blockR.v[16 * i + 8],
			blockR.v[16 * i + 9], blockR.v[16 * i + 10], blockR.v[16 * i + 11],
			blockR.v[16 * i + 12], blockR.v[16 * i + 13], blockR.v[16 * i + 14],
			blockR.v[16 * i + 15]);
	}

	/* Apply Blake2 on rows of 64-bit words: (0,1,16,17,...112,113), then
	   (2,3,18,19,...,114,115).. finally (14,15,30,31,...,126,127) */
	for (i = 0; i < 8; i++) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[2 * i], blockR.v[2 * i + 1], blockR.v[2 * i + 16],
			blockR.v[2 * i + 17], blockR.v[2 * i + 32], blockR.v[2 * i + 33],
			blockR.v[2 * i + 48], blockR.v[2 * i + 49], blockR.v[2 * i + 64],
			blockR.v[2 * i + 65], blockR.v[2 * i + 80], blockR.v[2 * i + 81],
			blockR.v[2 * i + 96], blockR.v[2 * i + 97], blockR.v[2 * i + 112],
			blockR.v[2 * i + 113]);
	}

	copy_block(next_block, &block_tmp);
	xor_block(next_block, &blockR);
}